

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O3

bool Js::JavascriptNumber::IsInt32OrUInt32_NoChecks(Var number)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (number == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x9c,"(number)","number");
    if (!bVar2) goto LAB_00cd9307;
    *puVar3 = 0;
LAB_00cd9251:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x9d,"(Is(number))","Is(number)");
    if (!bVar2) goto LAB_00cd9307;
    *puVar3 = 0;
  }
  else if (number < (Var)0x4000000000000) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    goto LAB_00cd9251;
  }
  if (number < (Var)0x4000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                ,0xd4,"(Is(aValue))","Ensure var is actually a \'JavascriptNumber\'"
                               );
    if (!bVar2) {
LAB_00cd9307:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = IsInt32OrUInt32((double)((ulong)number ^ 0xfffc000000000000));
  return bVar2;
}

Assistant:

bool JavascriptNumber::IsInt32OrUInt32_NoChecks(const Var number)
    {
        Assert(number);
        Assert(Is(number));

        return IsInt32OrUInt32(GetValue(number));
    }